

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O3

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QPageSize *ps;
  QPageSize *pQVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QArrayData *local_68;
  storage_type_conflict *local_60;
  long local_58;
  QArrayData *local_50;
  storage_type_conflict *local_48;
  long local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QPageSize::isValid();
  if (cVar2 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QPageSize::QPageSize((QPageSize *)this);
      return this;
    }
    goto LAB_0012c548;
  }
  if (pageSize[0x6b] == (QPageSize)0x0) {
    (**(code **)(*(long *)pageSize + 0x130))(pageSize);
  }
  iVar3 = QPageSize::id();
  if ((iVar3 != 0x1f) && (*(long *)(pageSize + 0x80) != 0)) {
    pQVar6 = *(QPageSize **)(pageSize + 0x78);
    lVar5 = *(long *)(pageSize + 0x80) << 3;
    do {
      iVar3 = QPageSize::id();
      iVar4 = QPageSize::id();
      if (iVar3 == iVar4) {
        QPageSize::name();
        QPageSize::name();
        if (local_40 == local_58) {
          QVar7.m_data = local_48;
          QVar7.m_size = local_40;
          QVar8.m_data = local_60;
          QVar8.m_size = local_40;
          cVar2 = QtPrivate::equalStrings(QVar7,QVar8);
        }
        else {
          cVar2 = '\0';
        }
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,2,0x10);
          }
        }
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (cVar2 != '\0') goto LAB_0012c51b;
      }
      pQVar6 = pQVar6 + 8;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  iVar3 = QPageSize::id();
  if ((iVar3 != 0x1f) && (*(long *)(pageSize + 0x80) != 0)) {
    pQVar6 = *(QPageSize **)(pageSize + 0x78);
    lVar5 = *(long *)(pageSize + 0x80) << 3;
    do {
      iVar3 = QPageSize::id();
      iVar4 = QPageSize::id();
      if (iVar3 == iVar4) goto LAB_0012c51b;
      pQVar6 = pQVar6 + 8;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  supportedPageSizeMatch(this,pageSize);
  goto LAB_0012c526;
LAB_0012c51b:
  QPageSize::QPageSize((QPageSize *)this,pQVar6);
LAB_0012c526:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
LAB_0012c548:
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QPageSize &pageSize) const
{
    if (!pageSize.isValid())
        return QPageSize();

    if (!m_havePageSizes)
        loadPageSizes();

    // First try match on name and id for case where printer defines same size twice with different names
    // e.g. Windows defines DMPAPER_11X17 and DMPAPER_TABLOID with names "11x17" and "Tabloid", but both
    // map to QPageSize::Tabloid / PPD Key "Tabloid" / ANSI B Tabloid
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id() && ps.name() == pageSize.name())
                return ps;
        }
    }

    // Next try match on id only if not custom
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id())
                return ps;
        }
    }

    // Next try a match on size, in case it's a custom with a different name
    return supportedPageSizeMatch(pageSize);
}